

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pbkdf2_test.cxx
# Opt level: O2

void test<cryptox::message_digest_algorithm<&EVP_sha1,160ul>>
               (size_t bits,string *key,string *salt,size_t rounds,string *expected)

{
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  key_first;
  __normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  salt_first;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *container;
  char *local_a8;
  char *local_a0;
  vector<unsigned_char,_std::allocator<unsigned_char>_> result;
  undefined **local_78;
  undefined1 local_70;
  undefined8 *local_68;
  char *local_60;
  string local_58;
  undefined1 *local_38;
  undefined1 *local_30;
  char *local_28;
  char *local_20;
  
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  key_first._M_current = (key->_M_dataplus)._M_p;
  salt_first._M_current = (salt->_M_dataplus)._M_p;
  cryptox::
  pbkdf2<cryptox::message_digest_algorithm<&EVP_sha1,160ul>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>,std::back_insert_iterator<std::vector<unsigned_char,std::allocator<unsigned_char>>>>
            (key_first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(key_first._M_current + key->_M_string_length),salt_first,
             (__normal_iterator<const_char_*,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              )(salt_first._M_current + salt->_M_string_length),rounds,&result,bits);
  local_28 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
  ;
  local_20 = "";
  local_38 = &boost::unit_test::basic_cstring<char_const>::null;
  local_30 = &boost::unit_test::basic_cstring<char_const>::null;
  boost::unit_test::unit_test_log_t::set_checkpoint
            (boost::unit_test::(anonymous_namespace)::unit_test_log,&local_28,0x22);
  local_70 = 0;
  local_78 = &PTR__lazy_ostream_002b7238;
  local_68 = &boost::unit_test::lazy_ostream::inst;
  local_60 = "";
  local_a8 = 
  "/workspace/llm4binary/github/license_c_cmakelists/madera[P]cryptox/tests/core/cryptox/key_derivation/pbkdf2_test.cxx"
  ;
  local_a0 = "";
  cryptox::to_hex<std::vector<unsigned_char,std::allocator<unsigned_char>>>
            (&local_58,(cryptox *)&result,container);
  boost::test_tools::tt_detail::
  check_frwd<boost::test_tools::tt_detail::equal_impl_frwd,std::__cxx11::string,std::__cxx11::string>
            (&local_78,&local_a8,0x22,1,2,&local_58,"to_hex(result)",expected,"expected");
  std::__cxx11::string::~string((string *)&local_58);
  std::_Vector_base<unsigned_char,_std::allocator<unsigned_char>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>);
  return;
}

Assistant:

void test(
	const size_t       bits,
	const std::string& key,
	const std::string& salt,
	const size_t       rounds,
	const std::string& expected
) {
	std::vector<std::uint8_t> result;

	pbkdf2<Algorithm>(key .begin(), key .end(),
	                  salt.begin(), salt.end(),
	                  rounds,
	                  std::back_inserter(result),
	                  bits);

	BOOST_CHECK_EQUAL(to_hex(result), expected);
}